

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.cpp
# Opt level: O0

bool common::OnlyHasDefaultSectionSetting(Settings *settings,string *section,string *name)

{
  long lVar1;
  long in_FS_OFFSET;
  Settings *in_stack_00000028;
  bool has_other_setting;
  bool has_default_section_setting;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (anonymous_namespace)::
  MergeSettings<common::OnlyHasDefaultSectionSetting(common::Settings_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
            (in_stack_00000028,(string *)settings,section,(anon_class_16_2_14b99272 *)name);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return false;
}

Assistant:

bool OnlyHasDefaultSectionSetting(const Settings& settings, const std::string& section, const std::string& name)
{
    bool has_default_section_setting = false;
    bool has_other_setting = false;
    MergeSettings(settings, section, name, [&](SettingsSpan span, Source source) {
        if (span.empty()) return;
        else if (source == Source::CONFIG_FILE_DEFAULT_SECTION) has_default_section_setting = true;
        else has_other_setting = true;
    });
    // If a value is set in the default section and not explicitly overwritten by the
    // user on the command line or in a different section, then we want to enable
    // warnings about the value being ignored.
    return has_default_section_setting && !has_other_setting;
}